

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::StructBuilderBody
          (GoGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  FieldDef *field;
  StructDef *struct_def_00;
  pointer pcVar1;
  char *pcVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  pointer ppFVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_d0;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string *local_90;
  string local_88;
  StructDef *local_68;
  char *local_60;
  string local_58;
  IdlNamer *local_38;
  
  local_90 = code_ptr;
  local_68 = struct_def;
  local_60 = nameprefix;
  NumToString<unsigned_long>(&local_88,struct_def->minalign);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x36cb11);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_8_ = plVar3[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_90,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_b0,local_68->bytesize);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_90,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  ppFVar6 = (local_68->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar6 !=
      (local_68->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = &this->namer_;
    do {
      field = ppFVar6[-1];
      if (field->padding != 0) {
        NumToString<unsigned_long>(&local_88,field->padding);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x36cb20);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_b0.field_2._M_allocated_capacity = *psVar4;
          local_b0.field_2._8_8_ = plVar3[3];
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar4;
          local_b0._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_b0._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_c0 = *plVar5;
          lStack_b8 = plVar3[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar5;
          local_d0 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_90,(ulong)local_d0);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      if (((field->value).type.base_type == BASE_TYPE_STRUCT) &&
         (struct_def_00 = (field->value).type.struct_def, struct_def_00->fixed == true)) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar1 = (field->super_Definition).name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,
                   pcVar1 + (field->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&local_b0);
        pcVar2 = local_60;
        strlen(local_60);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)pcVar2)
        ;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_c0 = *plVar5;
          lStack_b8 = plVar3[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar5;
          local_d0 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        StructBuilderBody(this,struct_def_00,(char *)local_d0,local_90);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        uVar7 = local_b0.field_2._M_allocated_capacity;
        _Var8._M_p = local_b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_002115a8:
          operator_delete(_Var8._M_p,uVar7 + 1);
        }
      }
      else {
        GenMethod_abi_cxx11_(&local_88,this,field);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x36bc03);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_b0.field_2._M_allocated_capacity = *psVar4;
          local_b0.field_2._8_8_ = plVar3[3];
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar4;
          local_b0._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_b0._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_c0 = *plVar5;
          lStack_b8 = plVar3[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar5;
          local_d0 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_90,(ulong)local_d0);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        (*(local_38->super_Namer)._vptr_Namer[7])(&local_88,local_38,field);
        pcVar2 = local_60;
        strlen(local_60);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)pcVar2)
        ;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_58.field_2._M_allocated_capacity = *psVar4;
          local_58.field_2._8_8_ = plVar3[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar4;
          local_58._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_58._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        CastToBaseType(&local_b0,this,&(field->value).type,&local_58);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_c0 = *plVar5;
          lStack_b8 = plVar3[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar5;
          local_d0 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_90,(ulong)local_d0);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        uVar7 = local_88.field_2._M_allocated_capacity;
        _Var8._M_p = local_88._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_002115a8;
      }
      ppFVar6 = ppFVar6 + -1;
    } while (ppFVar6 !=
             (local_68->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\tbuilder.Prep(" + NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding)
        code += "\tbuilder.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field.value.type)) {
        StructBuilderBody(*field.value.type.struct_def,
                          (nameprefix + (field.name + "_")).c_str(), code_ptr);
      } else {
        code += "\tbuilder.Prepend" + GenMethod(field) + "(";
        code += CastToBaseType(field.value.type,
                               nameprefix + namer_.Variable(field)) +
                ")\n";
      }
    }
  }